

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O0

Instr * __thiscall
LowererMD::Simd128ConvertToStore
          (LowererMD *this,Opnd *dst,Opnd *src1,uint8 dataWidth,Instr *instr,byte scaleFactor)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  IRType IVar4;
  OpCode opcode;
  int32 iVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *this_00;
  IndirOpnd *pIVar7;
  Instr *pIVar8;
  RegOpnd *dstOpnd;
  IntConstOpnd *src2Opnd;
  Opnd *this_01;
  IndirOpnd *this_02;
  Instr *movss;
  RegOpnd *temp;
  Instr *instrPrev;
  byte scaleFactor_local;
  Instr *instr_local;
  uint8 dataWidth_local;
  Opnd *src1_local;
  Opnd *dst_local;
  LowererMD *this_local;
  
  pIVar1 = instr->m_prev;
  if ((src1 == (Opnd *)0x0) || (bVar3 = IR::Opnd::IsSimd128(src1), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xb16,"(src1 && src1->IsSimd128())","src1 && src1->IsSimd128()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = IR::Opnd::IsIndirOpnd(dst);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xb17,"(dst->IsIndirOpnd())","dst->IsIndirOpnd()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (scaleFactor != '\0') {
    this_00 = Func::GetJITFunctionBody(this->m_func);
    bVar3 = JITTimeFunctionBody::IsAsmJsMode(this_00);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0xb1c,"(!m_func->GetJITFunctionBody()->IsAsmJsMode())",
                         "!m_func->GetJITFunctionBody()->IsAsmJsMode()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pIVar7 = IR::Opnd::AsIndirOpnd(dst);
    IR::IndirOpnd::SetScale(pIVar7,scaleFactor);
  }
  switch(dataWidth) {
  case '\x04':
    pIVar8 = IR::Instr::New(MOVSS,dst,src1,instr->m_func);
    IR::Instr::InsertBefore(instr,pIVar8);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xb3f,"((0))","(0)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
    break;
  case '\b':
    pIVar8 = IR::Instr::New(MOVSD,dst,src1,instr->m_func);
    IR::Instr::InsertBefore(instr,pIVar8);
    break;
  case '\f':
    IVar4 = IR::Opnd::GetType(src1);
    dstOpnd = IR::RegOpnd::New(IVar4,instr->m_func);
    pIVar8 = IR::Instr::New(MOVAPS,&dstOpnd->super_Opnd,src1,instr->m_func);
    IR::Instr::InsertBefore(instr,pIVar8);
    pIVar8 = IR::Instr::New(MOVSD,dst,&dstOpnd->super_Opnd,instr->m_func);
    IR::Instr::InsertBefore(instr,pIVar8);
    src2Opnd = IR::IntConstOpnd::New(8,TyInt8,this->m_func,true);
    pIVar8 = IR::Instr::New(PSRLDQ,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&src2Opnd->super_Opnd,
                            instr->m_func);
    IR::Instr::InsertBefore(instr,pIVar8);
    pIVar8 = IR::Instr::New(MOVSS,dst,&dstOpnd->super_Opnd,instr->m_func);
    IR::Instr::InsertBefore(instr,pIVar8);
    this_01 = IR::Instr::GetDst(pIVar8);
    pIVar7 = IR::Opnd::AsIndirOpnd(this_01);
    this_02 = IR::Opnd::AsIndirOpnd(dst);
    iVar5 = IR::IndirOpnd::GetOffset(this_02);
    IR::IndirOpnd::SetOffset(pIVar7,iVar5 + 8,true);
    break;
  case '\x10':
    IVar4 = IR::Opnd::GetType(src1);
    opcode = LowererMDArch::GetAssignOp(IVar4);
    pIVar8 = IR::Instr::New(opcode,dst,src1,instr->m_func);
    IR::Instr::InsertBefore(instr,pIVar8);
  }
  IR::Instr::Remove(instr);
  return pIVar1;
}

Assistant:

IR::Instr *
LowererMD::Simd128ConvertToStore(IR::Opnd *dst, IR::Opnd *src1, uint8 dataWidth, IR::Instr* instr, byte scaleFactor /* = 0 */)
{
    IR::Instr * instrPrev = instr->m_prev;

    Assert(src1 && src1->IsSimd128());
    Assert(dst->IsIndirOpnd());

    if (scaleFactor > 0)
    {
        // needed only for non-Asmjs code
        Assert(!m_func->GetJITFunctionBody()->IsAsmJsMode());
        dst->AsIndirOpnd()->SetScale(scaleFactor);
    }

    switch (dataWidth)
    {
    case 16:
        // MOVUPS dst([arrayBuffer + indexOpnd]), src1
        instr->InsertBefore(IR::Instr::New(LowererMDArch::GetAssignOp(src1->GetType()), dst, src1, instr->m_func));
        break;
    case 12:
    {
               IR::RegOpnd *temp = IR::RegOpnd::New(src1->GetType(), instr->m_func);
               IR::Instr *movss;
               // MOVAPS temp, src
               instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVAPS, temp, src1, instr->m_func));
               // MOVSD dst([arrayBuffer + indexOpnd]), temp
               instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVSD, dst, temp, instr->m_func));
               // PSRLDQ temp, 0x08
               instr->InsertBefore(IR::Instr::New(Js::OpCode::PSRLDQ, temp, temp, IR::IntConstOpnd::New(8, TyInt8, m_func, true), instr->m_func));
               // MOVSS dst([arrayBuffer + indexOpnd + 8]), temp
               movss = IR::Instr::New(Js::OpCode::MOVSS, dst, temp, instr->m_func);
               instr->InsertBefore(movss);
               movss->GetDst()->AsIndirOpnd()->SetOffset(dst->AsIndirOpnd()->GetOffset() + 8, true);
               break;
    }
    case 8:
        // MOVSD dst([arrayBuffer + indexOpnd]), src1
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVSD, dst, src1, instr->m_func));
        break;
    case 4:
        // MOVSS dst([arrayBuffer + indexOpnd]), src1
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVSS, dst, src1, instr->m_func));
        break;
    default:;
        Assume(UNREACHED);
    }
    instr->Remove();
    return instrPrev;
}